

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbbackingstore.cpp
# Opt level: O1

void __thiscall QFbBackingStore::resize(QFbBackingStore *this,QSize *size,QRegion *staticContents)

{
  Format FVar1;
  undefined8 uVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QImage local_50 [16];
  undefined8 local_40;
  code *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QImage::size();
  if (((size->wd).m_i != (int)uVar2) || ((size->ht).m_i != (int)((ulong)uVar2 >> 0x20))) {
    QPlatformBackingStore::window();
    QWindow::screen();
    plVar3 = (long *)QScreen::handle();
    FVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    QImage::QImage(local_50,size,FVar1);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_38);
    uVar2 = local_40;
    local_38 = QStringView::split;
    local_40 = 0;
    local_28 = *(undefined1 **)&this->field_0x20;
    *(undefined8 *)&this->field_0x20 = uVar2;
    QImage::~QImage((QImage *)&local_38);
    QImage::~QImage(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    if (mImage.size() != size)
        mImage = QImage(size, window()->screen()->handle()->format());
}